

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O0

uint ON_VersionNumberFromYearMonthDateFormat
               (uint version_number_major,uint YYYYMMDDn_version_number)

{
  bool bVar1;
  undefined4 local_38;
  undefined4 local_34;
  uint branch;
  uint minor_version;
  uint major_version;
  uint year;
  uint month;
  uint day_of_month;
  uint n;
  uint version_number;
  uint YYYYMMDDn_version_number_local;
  uint version_number_major_local;
  
  day_of_month = 0;
  bVar1 = ON_VersionNumberIsYearMonthDateFormat(version_number_major,YYYYMMDDn_version_number);
  if (bVar1) {
    local_38 = YYYYMMDDn_version_number % 10;
    local_34 = version_number_major;
    if (version_number_major == 0) {
      if ((local_38 == 0) || (8 < local_38)) {
        local_38 = 5;
      }
      local_34 = local_38;
    }
    day_of_month = ON_VersionNumberConstruct
                             (local_34,0,YYYYMMDDn_version_number / 100000,
                              (uint)(((ulong)YYYYMMDDn_version_number / 1000) % 100),
                              (uint)(((ulong)YYYYMMDDn_version_number / 10) % 100),0);
  }
  return day_of_month;
}

Assistant:

unsigned int ON_VersionNumberFromYearMonthDateFormat(
  unsigned int version_number_major,
  unsigned int YYYYMMDDn_version_number
  )
{
  unsigned int version_number = 0;
  if ( ON_VersionNumberIsYearMonthDateFormat(version_number_major,YYYYMMDDn_version_number) )
  {
    // convert old format to new format
    unsigned int n = (YYYYMMDDn_version_number % 10);
    unsigned int day_of_month = (YYYYMMDDn_version_number/10) % 100;
    unsigned int month = (YYYYMMDDn_version_number/1000) % 100;
    unsigned int year = (YYYYMMDDn_version_number/100000);

    unsigned int major_version = (version_number_major > 0 )
                               ? version_number_major
                               : ((n > 0 && n < 9) ? n : 5);
    unsigned int minor_version = 0;
    unsigned int branch = 0; // 0 = developer
    version_number = ON_VersionNumberConstruct(
      major_version,
      minor_version,
      year,
      month,
      day_of_month,
      branch
      );
  }
  return version_number;
}